

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

void __thiscall
axl::sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
          (StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *this,BufHdr *hdr)

{
  int32_t *piVar1;
  FreeFunc *pFVar2;
  BufHdr *pBVar3;
  
  pBVar3 = this->m_hdr;
  if (pBVar3 != hdr) {
    if (hdr != (BufHdr *)0x0) {
      LOCK();
      piVar1 = &(hdr->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      pBVar3 = this->m_hdr;
    }
    if (pBVar3 != (BufHdr *)0x0) {
      LOCK();
      piVar1 = &(pBVar3->super_RefCount).m_refCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        (**(pBVar3->super_RefCount)._vptr_RefCount)(pBVar3);
        LOCK();
        piVar1 = &(pBVar3->super_RefCount).m_weakRefCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if ((*piVar1 == 0) &&
           (pFVar2 = (pBVar3->super_RefCount).m_freeFunc, pFVar2 != (FreeFunc *)0x0)) {
          (*pFVar2)(pBVar3);
        }
      }
    }
    this->m_hdr = hdr;
  }
  return;
}

Assistant:

void
	attachBufHdr(rc::BufHdr* hdr) const {
		if (hdr == m_hdr)
			return; // try to avoid unnecessary interlocked ops

		if (hdr)
			hdr->addRef();

		if (m_hdr)
			m_hdr->release();

		m_hdr = hdr;
	}